

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

void __thiscall
google::protobuf::
Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
InnerMap::clear(InnerMap *this)

{
  _Rb_tree<long_*,_long_*,_std::_Identity<long_*>,_google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::InnerMap::KeyCompare,_google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::MapAllocator<long_*>_>
  *p_Var1;
  void *pvVar2;
  LogMessage *other;
  void **ppvVar3;
  _Base_ptr p_Var4;
  ulong uVar5;
  ulong uVar6;
  _Rb_tree<long_*,_long_*,_std::_Identity<long_*>,_google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::InnerMap::KeyCompare,_google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::MapAllocator<long_*>_>
  *this_00;
  const_iterator __position;
  LogFinisher local_71;
  ulong local_70;
  LogMessage local_68;
  
  if (this->num_buckets_ == 0) {
    uVar5 = 0;
  }
  else {
    uVar6 = 0;
    do {
      ppvVar3 = this->table_;
      this_00 = (_Rb_tree<long_*,_long_*,_std::_Identity<long_*>,_google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::InnerMap::KeyCompare,_google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::MapAllocator<long_*>_>
                 *)ppvVar3[uVar6];
      if (this_00 !=
          (_Rb_tree<long_*,_long_*,_std::_Identity<long_*>,_google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::InnerMap::KeyCompare,_google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::MapAllocator<long_*>_>
           *)0x0) {
        if (this_00 ==
            (_Rb_tree<long_*,_long_*,_std::_Identity<long_*>,_google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::InnerMap::KeyCompare,_google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::MapAllocator<long_*>_>
             *)ppvVar3[uVar6 ^ 1]) {
          if (((uVar6 & 1) != 0) ||
             (this_00 !=
              (_Rb_tree<long_*,_long_*,_std::_Identity<long_*>,_google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::InnerMap::KeyCompare,_google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::MapAllocator<long_*>_>
               *)ppvVar3[uVar6 + 1])) {
            internal::LogMessage::LogMessage
                      (&local_68,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
                       ,0x1fe);
            other = internal::LogMessage::operator<<
                              (&local_68,
                               "CHECK failed: table_[b] == table_[b + 1] && (b & 1) == 0: ");
            internal::LogFinisher::operator=(&local_71,other);
            internal::LogMessage::~LogMessage(&local_68);
            ppvVar3 = this->table_;
          }
          local_70 = uVar6 + 1;
          ppvVar3[uVar6 + 1] = (void *)0x0;
          this->table_[uVar6] = (void *)0x0;
          __position._M_node = (this_00->_M_impl).super__Rb_tree_header._M_header._M_left;
          do {
            pvVar2 = *(void **)(__position._M_node + 1);
            p_Var4 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
            std::
            _Rb_tree<long_*,_long_*,_std::_Identity<long_*>,_google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::InnerMap::KeyCompare,_google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::MapAllocator<long_*>_>
            ::_M_erase_aux(this_00,__position);
            if ((this->alloc_).arena_ == (Arena *)0x0) {
              operator_delete(pvVar2,0x18);
            }
            __position._M_node = p_Var4;
          } while ((_Rb_tree_header *)p_Var4 != &(this_00->_M_impl).super__Rb_tree_header);
          DestroyTree(this,(Tree *)this_00);
          uVar6 = local_70;
        }
        else {
          ppvVar3[uVar6] = (void *)0x0;
          do {
            p_Var1 = *(_Rb_tree<long_*,_long_*,_std::_Identity<long_*>,_google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::InnerMap::KeyCompare,_google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::MapAllocator<long_*>_>
                       **)&(this_00->_M_impl).super__Rb_tree_header._M_header;
            if ((this->alloc_).arena_ == (Arena *)0x0) {
              operator_delete(this_00,0x18);
            }
            this_00 = p_Var1;
          } while (p_Var1 != (_Rb_tree<long_*,_long_*,_std::_Identity<long_*>,_google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::InnerMap::KeyCompare,_google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::MapAllocator<long_*>_>
                              *)0x0);
        }
      }
      uVar6 = uVar6 + 1;
      uVar5 = this->num_buckets_;
    } while (uVar6 < uVar5);
  }
  this->num_elements_ = 0;
  this->index_of_first_non_null_ = uVar5;
  return;
}

Assistant:

void clear() {
      for (size_type b = 0; b < num_buckets_; b++) {
        if (TableEntryIsNonEmptyList(b)) {
          Node* node = static_cast<Node*>(table_[b]);
          table_[b] = NULL;
          do {
            Node* next = node->next;
            DestroyNode(node);
            node = next;
          } while (node != NULL);
        } else if (TableEntryIsTree(b)) {
          Tree* tree = static_cast<Tree*>(table_[b]);
          GOOGLE_DCHECK(table_[b] == table_[b + 1] && (b & 1) == 0);
          table_[b] = table_[b + 1] = NULL;
          typename Tree::iterator tree_it = tree->begin();
          do {
            Node* node = NodePtrFromKeyPtr(*tree_it);
            typename Tree::iterator next = tree_it;
            ++next;
            tree->erase(tree_it);
            DestroyNode(node);
            tree_it = next;
          } while (tree_it != tree->end());
          DestroyTree(tree);
          b++;
        }
      }
      num_elements_ = 0;
      index_of_first_non_null_ = num_buckets_;
    }